

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void __thiscall Block<float>::verify_block(Block<float> *this,ProxyWithLink *cp)

{
  float fVar1;
  pointer pfVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    pfVar2 = (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pfVar2 >> 2) <= uVar4) break;
    fVar1 = pfVar2[uVar4];
    if ((fVar1 < this->min) || (this->max <= fVar1 && fVar1 != this->max)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Warning: ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(this->values).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar4]);
      poVar3 = std::operator<<(poVar3," outside of [");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->min);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->max);
      poVar3 = std::operator<<(poVar3,"]");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    uVar4 = uVar4 + 1;
  }
  diy::Master::Proxy::all_reduce<unsigned_long,std::plus<unsigned_long>>(&cp->super_Proxy);
  return;
}

Assistant:

void          verify_block(const diy::Master::ProxyWithLink& cp)
  {
    for (size_t i = 0; i < values.size(); ++i)
      if (values[i] < min || values[i] > max)
        std::cout << "Warning: " << values[i] << " outside of [" << min << "," << max << "]" << std::endl;

    cp.all_reduce(values.size(), std::plus<size_t>());
  }